

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unixepochFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  long lVar1;
  int iVar2;
  sqlite3_context *in_RDX;
  DateTime *in_RDI;
  long in_FS_OFFSET;
  DateTime x;
  double in_stack_ffffffffffffffa8;
  sqlite3_value **in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  sqlite3_context *in_stack_ffffffffffffffd8;
  byte local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&stack0xffffffffffffffc8,&DAT_002af520,0x30);
  iVar2 = isDate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
                 in_RDI);
  if (iVar2 == 0) {
    computeJD(in_RDI);
    if ((local_c >> 2 & 1) == 0) {
      sqlite3_result_int64(in_RDX,(i64)in_stack_ffffffffffffffa8);
    }
    else {
      sqlite3_result_double(in_RDX,in_stack_ffffffffffffffa8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void unixepochFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    computeJD(&x);
    if( x.useSubsec ){
      sqlite3_result_double(context, (x.iJD - 21086676*(i64)10000000)/1000.0);
    }else{
      sqlite3_result_int64(context, x.iJD/1000 - 21086676*(i64)10000);
    }
  }
}